

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULibCal.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  RTIMUSettings *this;
  RTIMUMagCal *this_00;
  RTIMUAccelCal *this_01;
  char *pcVar2;
  termios ctty;
  
  if (argc == 2) {
    pcVar2 = argv[1];
  }
  else {
    pcVar2 = "RTIMULib";
  }
  printf("RTIMULibCal - using %s.ini\n",pcVar2);
  this = (RTIMUSettings *)operator_new(0x2b0);
  RTIMUSettings::RTIMUSettings(this,pcVar2);
  imu = (RTIMU *)0x0;
  settings = this;
  newIMU();
  *(undefined2 *)(imu + 8) = 0x101;
  this_00 = (RTIMUMagCal *)operator_new(0x3a9f0);
  RTIMUMagCal::RTIMUMagCal(this_00,settings);
  magCal = this_00;
  RTIMUMagCal::magCalInit();
  magMinMaxDone = 0;
  this_01 = (RTIMUAccelCal *)operator_new(0x40);
  RTIMUAccelCal::RTIMUAccelCal(this_01,settings);
  accelCal = this_01;
  RTIMUAccelCal::accelCalInit();
  iVar1 = fileno(_stdout);
  tcgetattr(iVar1,(termios *)&ctty);
  ctty.c_lflag._0_1_ = (byte)ctty.c_lflag & 0xfd;
  iVar1 = fileno(_stdout);
  tcsetattr(iVar1,0,(termios *)&ctty);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          displayMenu();
          iVar1 = getchar();
          iVar1 = tolower(iVar1);
          if (iVar1 != 0x61) break;
          doAccelCal();
        }
        if (iVar1 != 0x65) break;
        doMagEllipsoidCal();
      }
      if (iVar1 != 0x6d) break;
      doMagMinMaxCal();
    }
  } while (iVar1 != 0x78);
  puts("\nRTIMULibCal exiting");
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    char *settingsFile;

    if (argc == 2)
        settingsFile = argv[1];
    else
        settingsFile = (char *)"RTIMULib";

    printf("RTIMULibCal - using %s.ini\n", settingsFile);

    settings = new RTIMUSettings(settingsFile);

    bool mustExit = false;
    imu = NULL;
    newIMU();

    //  set up for calibration run

    imu->setCompassCalibrationMode(true);
    imu->setAccelCalibrationMode(true);
    magCal = new RTIMUMagCal(settings);
    magCal->magCalInit();
    magMinMaxDone = false;
    accelCal = new RTIMUAccelCal(settings);
    accelCal->accelCalInit();

    //  set up console io

    struct termios	ctty;

    tcgetattr(fileno(stdout), &ctty);
    ctty.c_lflag &= ~(ICANON);
    tcsetattr(fileno(stdout), TCSANOW, &ctty);

    //  the main loop

    while (!mustExit) {
        displayMenu();
        switch (tolower(getchar())) {
        case 'x' :
            mustExit = true;
            break;

        case 'm' :
            doMagMinMaxCal();
            break;

        case 'e' :
            doMagEllipsoidCal();
            break;

        case 'a' :
            doAccelCal();
            break;
        }
    }

    printf("\nRTIMULibCal exiting\n");
    return 0;
}